

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O2

void pnga_strided_put(Integer g_a,Integer *lo,Integer *hi,Integer *skip,void *buf,Integer *ld)

{
  short sVar1;
  Integer *lo_00;
  int iVar2;
  int iVar3;
  Integer IVar4;
  long ndim;
  long lVar5;
  char *dst_ptr;
  int proc;
  char *prem;
  Integer idx_buf;
  Integer *bhi;
  Integer *blo;
  Integer nstride;
  Integer plo [7];
  int count [14];
  Integer phi [7];
  Integer ldrem [7];
  int stride_loc [14];
  int stride_rem [14];
  _iterator_hdl it_hdl;
  int local_504;
  Integer *local_500;
  Integer *local_4f8;
  long local_4f0;
  long local_4e8;
  Integer *local_4e0;
  char *local_4d8;
  long local_4d0;
  void *local_4c8;
  Integer *local_4c0;
  Integer *local_4b8;
  int local_4b0 [2];
  Integer local_4a8 [8];
  int local_468 [16];
  Integer local_428 [8];
  Integer local_3e8 [8];
  int local_3a8 [16];
  int local_368 [14];
  _iterator_hdl local_330;
  
  local_4e8 = (long)GA[g_a + 1000].elemsize;
  sVar1 = GA[g_a + 1000].ndim;
  ndim = (long)sVar1;
  lVar5 = 0;
  local_500 = hi;
  local_4f8 = lo;
  local_4e0 = ld;
  local_4c8 = buf;
  pnga_nnodes();
  local_4f0 = (long)GA[g_a + 1000].p_handle;
  iVar2 = (int)sVar1;
  if (sVar1 < 1) {
    iVar2 = 0;
  }
  for (; iVar2 != lVar5; lVar5 = lVar5 + 1) {
    if (skip[lVar5] < 1) {
      pnga_error("nga_strided_put: Invalid value of skip along coordinate ",lVar5);
    }
  }
  gai_iterator_init(g_a,local_4f8,local_500,&local_330);
  local_500 = (Integer *)(local_4f0 * 0x28);
  while( true ) {
    iVar3 = gai_iterator_next(&local_330,&local_504,&local_4b8,&local_4c0,&local_4d8,local_3e8);
    lo_00 = local_4b8;
    if (iVar3 == 0) break;
    for (lVar5 = 0; iVar2 != lVar5; lVar5 = lVar5 + 1) {
      local_4a8[lVar5] = local_4b8[lVar5];
      local_428[lVar5] = local_4c0[lVar5];
    }
    IVar4 = gai_correct_strided_patch(ndim,local_4f8,skip,local_4a8,local_428);
    if (IVar4 != 0) {
      gai_FindOffset(ndim,lo_00,local_4a8,local_3e8,&local_4d0);
      lVar5 = local_4e8;
      dst_ptr = local_4d8 + local_4d0 * local_4e8;
      local_4d8 = dst_ptr;
      gai_ComputePatchIndexWithSkip(ndim,local_4f8,local_4a8,skip,local_4e0,&local_4d0);
      lVar5 = local_4d0 * lVar5;
      iVar3 = gai_ComputeCountWithSkip(ndim,local_4a8,local_428,skip,local_468,(Integer *)local_4b0)
      ;
      if (iVar3 != 0) {
        local_468[0] = local_468[0] * (int)local_4e8;
        gai_SetStrideWithSkip(ndim,local_4e8,local_4e0,local_3e8,local_368,local_3a8,skip);
        if ((int)local_4f0 != -1) {
          local_504 = *(int *)(*(long *)((long)&PGRP_LIST->inv_map_proc_list + (long)local_500) +
                              (long)local_504 * 4);
        }
        ARMCI_PutS((void *)(lVar5 + (long)local_4c8),local_3a8,dst_ptr,local_368,local_468,
                   local_4b0[0] + -1,local_504);
      }
    }
  }
  gai_iterator_destroy(&local_330);
  return;
}

Assistant:

void pnga_strided_put(Integer g_a, Integer *lo, Integer *hi, Integer *skip,
                     void    *buf, Integer *ld)
{
  /* g_a:    Global Array handle
     lo[]:   Array of lower indices of patch of global array
     hi[]:   Array of upper indices of patch of global array
     skip[]: Array of skips for each dimension
     buf[]:  Local buffer that patch will be copied from
     ld[]:   ndim-1 physical dimensions of local buffer */
  Integer p, np=0, handle = GA_OFFSET + g_a;
  Integer idx, size, nstride, p_handle, nproc;
  Integer ldrem[MAXDIM];
  Integer idx_buf, *blo, *bhi;
  Integer plo[MAXDIM],phi[MAXDIM];
  char *pbuf, *prem;
  int count[2*MAXDIM], stride_rem[2*MAXDIM], stride_loc[2*MAXDIM];
  int i, proc, ndim;
  _iterator_hdl it_hdl;

  size = GA[handle].elemsize;
  ndim = GA[handle].ndim;
  nproc = pnga_nnodes();
  p_handle = GA[handle].p_handle;

  /* check values of skips to make sure they are legitimate */
  for (i = 0; i<ndim; i++) {
    if (skip[i]<1) {
      pnga_error("nga_strided_put: Invalid value of skip along coordinate ",i);
    }
  }

  gai_iterator_init(g_a, lo, hi, &it_hdl);
  while (gai_iterator_next(&it_hdl, &proc, &blo, &bhi, &prem, ldrem)) {
      /* Correct ranges to account for skips in original patch. If no
         data is left in patch jump to next processor in loop. */
      for (i=0; i<ndim; i++) {
        plo[i] = blo[i];
        phi[i] = bhi[i];
      }
      if (!gai_correct_strided_patch((Integer)ndim, lo, skip, plo, phi))
        continue;
      /* May need to correct location of remote buffer */
      gai_FindOffset(ndim,blo,plo,ldrem,&idx_buf);
      prem += size*idx_buf;

      /* get pointer in local buffer to point indexed by plo given that
         the corner of the buffer corresponds to the point indexed by lo */
      gai_ComputePatchIndexWithSkip(ndim, lo, plo, skip, ld, &idx_buf);
      pbuf = size*idx_buf + (char*)buf;

      /* Compute number of elements in each stride region and compute the
         number of stride regions. Store the results in count and nstride */
      if (!gai_ComputeCountWithSkip(ndim, plo, phi, skip, count, &nstride))
        continue;

      /* Scale first element in count by element size. The ARMCI_PutS routine
         uses this convention to figure out memory sizes. */
      count[0] *= size;

      /* Calculate strides in memory for remote processor indexed by proc and
         local buffer */ 
      gai_SetStrideWithSkip(ndim, size, ld, ldrem, stride_rem, stride_loc,
          skip);

      /* BJP */
      if (p_handle != -1) {
        proc = PGRP_LIST[p_handle].inv_map_proc_list[proc];
      }
      ARMCI_PutS(pbuf, stride_loc, prem, stride_rem, count, nstride-1, proc);
  }
  gai_iterator_destroy(&it_hdl);
}